

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O2

AVisitor<hiberlite::UpdateBean> * __thiscall
hiberlite::AVisitor<hiberlite::UpdateBean>::operator&
          (AVisitor<hiberlite::UpdateBean> *this,sql_nvp<double> *nvp)

{
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)nvp);
  divePrefix(this,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  walk<double>(this,nvp->value);
  popScope(this);
  return this;
}

Assistant:

AVisitor<C>& AVisitor<C>::operator&(sql_nvp<X> nvp)
{
	divePrefix(nvp.name);
		walk(nvp.value);
	pop();
	return *this;
}